

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferBufferParameters.cpp
# Opt level: O3

GLboolean __thiscall
glcts::TextureBufferBufferParameters::queryBufferPointerv
          (TextureBufferBufferParameters *this,GLenum target,GLenum pname,GLvoid *expected_pointer)

{
  ostringstream *this_00;
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  bool bVar2;
  GLvoid *result_pointer;
  GLvoid *local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_1b8 = (GLvoid *)0x0;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x7b0))(target,pname,&local_1b8);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"Could not get the mapped buffer\'s pointer using getBufferPointerv!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferBufferParameters.cpp"
                  ,0xb4);
  bVar2 = local_1b8 == expected_pointer;
  if (!bVar2) {
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"glGetBufferPointerv(pname == ",0x1d);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,") returned pointer ",0x13);
    std::ostream::_M_insert<void_const*>(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00," which is not equal to expected pointer ",0x28);
    std::ostream::_M_insert<void_const*>(this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,".",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
  }
  return bVar2;
}

Assistant:

glw::GLboolean TextureBufferBufferParameters::queryBufferPointerv(glw::GLenum target, glw::GLenum pname,
																  glw::GLvoid* expected_pointer)
{
	/* Retrieve GLES entry points. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLvoid*   result_pointer = DE_NULL;
	glw::GLboolean test_passed	= true;

	gl.getBufferPointerv(target, pname, &result_pointer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not get the mapped buffer's pointer using getBufferPointerv!");

	if (result_pointer != expected_pointer)
	{
		test_passed = false;

		m_testCtx.getLog() << tcu::TestLog::Message << "glGetBufferPointerv(pname == " << pname << ") returned pointer "
						   << result_pointer << " which is not equal to expected pointer " << expected_pointer << "."
						   << tcu::TestLog::EndMessage;
	}

	return test_passed;
}